

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O3

int ffcpfl(fitsfile *infptr,fitsfile *outfptr,int previous,int current,int following,int *status)

{
  int iVar1;
  int iVar2;
  int hdunum;
  int local_38;
  int local_34;
  
  iVar2 = *status;
  if (0 < iVar2) {
    return iVar2;
  }
  if (infptr == outfptr) {
    *status = 0x65;
    iVar2 = 0x65;
  }
  else {
    _local_38 = CONCAT44(following,iVar2);
    ffghdn(infptr,&local_38);
    if (1 < local_38 && previous != 0) {
      iVar2 = 1;
      do {
        ffmahd(infptr,iVar2,(int *)0x0,status);
        ffcopy(infptr,outfptr,0,status);
        iVar2 = iVar2 + 1;
      } while (iVar2 < local_38);
    }
    if ((current != 0) && (*status < 1)) {
      ffmahd(infptr,local_38,(int *)0x0,status);
      ffcopy(infptr,outfptr,0,status);
    }
    if ((local_34 != 0) && (*status < 1)) {
      iVar2 = local_38;
      do {
        iVar2 = iVar2 + 1;
        iVar1 = ffmahd(infptr,iVar2,(int *)0x0,status);
        if (iVar1 != 0) {
          if (*status == 0x6b) {
            *status = 0;
          }
          break;
        }
        iVar1 = ffcopy(infptr,outfptr,0,status);
      } while (iVar1 == 0);
    }
    ffmahd(infptr,local_38,(int *)0x0,status);
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffcpfl(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int previous,        /* I - copy any previous HDUs?   */
           int current,         /* I - copy the current HDU?     */
           int following,       /* I - copy any following HDUs?   */
           int *status)         /* IO - error status     */
/*
  copy all or part of the input file to the output file.
*/
{
    int hdunum, ii;

    if (*status > 0)
        return(*status);

    if (infptr == outfptr)
        return(*status = SAME_FILE);

    ffghdn(infptr, &hdunum);

    if (previous) {   /* copy any previous HDUs */
        for (ii=1; ii < hdunum; ii++) {
            ffmahd(infptr, ii, NULL, status);
            ffcopy(infptr, outfptr, 0, status);
        }
    }

    if (current && (*status <= 0) ) {  /* copy current HDU */
        ffmahd(infptr, hdunum, NULL, status);
        ffcopy(infptr, outfptr, 0, status);
    }

    if (following && (*status <= 0) ) { /* copy any remaining HDUs */
        ii = hdunum + 1;
        while (1)
        { 
            if (ffmahd(infptr, ii, NULL, status) ) {
                 /* reset expected end of file status */
                 if (*status == END_OF_FILE)
                    *status = 0;
                 break;
            }

            if (ffcopy(infptr, outfptr, 0, status))
                 break;  /* quit on unexpected error */

            ii++;
        }
    }

    ffmahd(infptr, hdunum, NULL, status);  /* restore initial position */
    return(*status);
}